

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_object___lookupGetter__
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int setter)

{
  JSValue v;
  JSValue obj_00;
  JSValue val;
  JSValue v_00;
  JSValue JVar1;
  int iVar2;
  JSAtom JVar3;
  JSContext *in_RDI;
  int in_R9D;
  JSValue JVar4;
  JSAtom in_stack_00000054;
  JSObject *in_stack_00000058;
  JSPropertyDescriptor *in_stack_00000060;
  JSContext *in_stack_00000068;
  int has_prop;
  JSPropertyDescriptor desc;
  JSAtom prop;
  JSValue obj;
  JSValue res;
  undefined4 in_stack_fffffffffffffef8;
  JSAtom in_stack_fffffffffffffefc;
  JSContext *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  JSValueUnion in_stack_ffffffffffffff10;
  JSValueUnion in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  JSValueUnion in_stack_ffffffffffffff30;
  int64_t in_stack_ffffffffffffff38;
  JSContext *local_c0;
  JSValueUnion local_b8;
  int64_t local_b0;
  uint local_90;
  JSValueUnion local_78;
  JSContext *in_stack_ffffffffffffff90;
  JSValueUnion in_stack_ffffffffffffff98;
  JSContext *in_stack_ffffffffffffffa0;
  JSValueUnion local_10;
  int64_t local_8;
  
  local_10.float64 = 0.0;
  local_8 = 6;
  JVar4.tag = (int64_t)in_stack_ffffffffffffffa0;
  JVar4.u.float64 = in_stack_ffffffffffffff98.float64;
  JVar4 = JS_ToObject(in_stack_ffffffffffffff90,JVar4);
  iVar2 = JS_IsException(JVar4);
  if ((iVar2 == 0) &&
     (val.tag = in_stack_ffffffffffffff38, val.u.float64 = in_stack_ffffffffffffff30.float64,
     JVar3 = JS_ValueToAtom((JSContext *)
                            CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),val),
     local_c0 = in_stack_ffffffffffffff90, JVar3 != 0)) {
    do {
      iVar2 = JS_GetOwnPropertyInternal
                        (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000054);
      if (iVar2 < 0) break;
      if (iVar2 != 0) {
        if ((local_90 & 0x10) == 0) {
          local_10.ptr = (void *)((ulong)in_stack_ffffffffffffff2c << 0x20);
          local_8 = 3;
        }
        else {
          if (in_R9D != 0) {
            local_78 = in_stack_ffffffffffffff98;
            local_c0 = in_stack_ffffffffffffffa0;
          }
          v_00.tag = (int64_t)local_c0;
          v_00.u.float64 = local_78.float64;
          JVar4 = JS_DupValue(in_RDI,v_00);
          local_b8 = JVar4.u;
          local_10 = local_b8;
          local_b0 = JVar4.tag;
          local_8 = local_b0;
          in_stack_ffffffffffffff00 = in_RDI;
        }
        js_free_desc(in_stack_ffffffffffffff00,
                     (JSPropertyDescriptor *)
                     CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        break;
      }
      obj_00.tag = (int64_t)in_stack_ffffffffffffff18.ptr;
      obj_00.u.ptr = in_stack_ffffffffffffff10.ptr;
      JVar4 = JS_GetPrototypeFree((JSContext *)
                                  CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                  obj_00);
      in_stack_ffffffffffffff18 = JVar4.u;
      iVar2 = JS_IsException(JVar4);
      if (iVar2 != 0) break;
      iVar2 = JS_IsNull(JVar4);
      if (iVar2 != 0) {
        in_stack_ffffffffffffff08 = 0;
        in_stack_ffffffffffffff10.float64 = 1.48219693752374e-323;
        local_10.ptr = (void *)((ulong)in_stack_ffffffffffffff0c << 0x20);
        local_8 = 3;
        break;
      }
      iVar2 = js_poll_interrupts((JSContext *)
                                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    } while (iVar2 == 0);
  }
  JS_FreeAtom(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  v.u._4_4_ = in_stack_ffffffffffffff0c;
  v.u.int32 = in_stack_ffffffffffffff08;
  v.tag = (int64_t)in_stack_ffffffffffffff10.ptr;
  JS_FreeValue(in_stack_ffffffffffffff00,v);
  JVar1.tag = local_8;
  JVar1.u.float64 = local_10.float64;
  return JVar1;
}

Assistant:

static JSValue js_object___lookupGetter__(JSContext *ctx, JSValueConst this_val,
                                          int argc, JSValueConst *argv, int setter)
{
    JSValue obj, res = JS_EXCEPTION;
    JSAtom prop = JS_ATOM_NULL;
    JSPropertyDescriptor desc;
    int has_prop;

    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj))
        goto exception;
    prop = JS_ValueToAtom(ctx, argv[0]);
    if (unlikely(prop == JS_ATOM_NULL))
        goto exception;

    for (;;) {
        has_prop = JS_GetOwnPropertyInternal(ctx, &desc, JS_VALUE_GET_OBJ(obj), prop);
        if (has_prop < 0)
            goto exception;
        if (has_prop) {
            if (desc.flags & JS_PROP_GETSET)
                res = JS_DupValue(ctx, setter ? desc.setter : desc.getter);
            else
                res = JS_UNDEFINED;
            js_free_desc(ctx, &desc);
            break;
        }
        obj = JS_GetPrototypeFree(ctx, obj);
        if (JS_IsException(obj))
            goto exception;
        if (JS_IsNull(obj)) {
            res = JS_UNDEFINED;
            break;
        }
        /* avoid infinite loop (possible with proxies) */
        if (js_poll_interrupts(ctx))
            goto exception;
    }

exception:
    JS_FreeAtom(ctx, prop);
    JS_FreeValue(ctx, obj);
    return res;
}